

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void arm946_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  ARMCPU *cpu;
  CPUState *obj_local;
  uc_struct_conflict1 *uc_local;
  
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0xf);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),7);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x14);
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x41059461;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x323c) = 0xf004006;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x648) = 0x78;
  return;
}

Assistant:

static void arm946_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    set_feature(&cpu->env, ARM_FEATURE_V5);
    set_feature(&cpu->env, ARM_FEATURE_PMSA);
    set_feature(&cpu->env, ARM_FEATURE_DUMMY_C15_REGS);
    cpu->midr = 0x41059461;
    cpu->ctr = 0x0f004006;
    cpu->reset_sctlr = 0x00000078;
}